

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

ES5ArrayTypeHandlerBase<unsigned_short> * __thiscall
Js::PathTypeHandlerBase::ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>>
          (PathTypeHandlerBase *this,DynamicObject *instance)

{
  code *pcVar1;
  DictionaryPropertyDescriptor<unsigned_short> *propertyRecord_00;
  ushort uVar2;
  PropertyIndex PVar3;
  ES5ArrayTypeHandlerBase<unsigned_short> *oldTypeHandler_00;
  PathTypeHandlerBase *pPVar4;
  bool bVar5;
  byte bVar6;
  PropertyAttributes PVar7;
  BYTE values;
  PropertyTypes values_00;
  uint16 uVar8;
  uint16 offsetOfInlineSlots;
  unsigned_short uVar9;
  int iVar10;
  uint uVar11;
  undefined4 *puVar12;
  Recycler *alloc;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar13;
  ScriptContext *pSVar14;
  RecyclerWeakReference<Js::DynamicObject> *pRVar15;
  undefined4 extraout_var;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  TypePath *pTVar16;
  DynamicType *newType;
  bool local_151;
  bool local_121;
  ObjectSlotAttributes local_109;
  byte local_102;
  byte local_101;
  DictionaryPropertyDescriptor<unsigned_short> *pDStack_c0;
  bool result;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyRecord *propertyRecord;
  ObjectSlotAttributes attr;
  TypePath *pTStack_a8;
  PropertyIndex i;
  TypePath *typePath;
  ObjectSlotAttributes *attributes;
  bool transferUsedAsFixed;
  RecyclerWeakReference<Js::DynamicObject> *pRStack_90;
  bool transferFixed;
  RecyclerWeakReference<Js::DynamicObject> *curSingletonInstance;
  RecyclerWeakReference<Js::DynamicObject> *pRStack_80;
  bool canBeSingletonInstance;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstance;
  DynamicType *oldType;
  undefined8 local_68;
  TrackAllocData local_60;
  ES5ArrayTypeHandlerBase<unsigned_short> *local_38;
  ES5ArrayTypeHandlerBase<unsigned_short> *newTypeHandler;
  PathTypeHandlerBase *oldTypeHandler;
  Recycler *recycler;
  ScriptContext *scriptContext;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  scriptContext = (ScriptContext *)instance;
  instance_local = (DynamicObject *)this;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x596,"(instance)","instance");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  recycler = (Recycler *)RecyclableObject::GetScriptContext((RecyclableObject *)scriptContext);
  oldTypeHandler = (PathTypeHandlerBase *)ScriptContext::GetRecycler((ScriptContext *)recycler);
  (*(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x68])();
  bVar5 = DynamicObject::DeoptimizeObjectHeaderInlining((DynamicObject *)scriptContext);
  newTypeHandler = (ES5ArrayTypeHandlerBase<unsigned_short> *)this;
  if (bVar5) {
    newTypeHandler =
         (ES5ArrayTypeHandlerBase<unsigned_short> *)
         DynamicObject::GetTypeHandler((DynamicObject *)scriptContext);
  }
  if (newTypeHandler == (ES5ArrayTypeHandlerBase<unsigned_short> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5ae,"(oldTypeHandler)","oldTypeHandler");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  pPVar4 = oldTypeHandler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&ES5ArrayTypeHandlerBase<unsigned_short>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
             ,0x5b0);
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)pPVar4,&local_60);
  oldType = (DynamicType *)Memory::Recycler::AllocInlined;
  local_68 = 0;
  pEVar13 = (ES5ArrayTypeHandlerBase<unsigned_short> *)new<Memory::Recycler>(0x40,alloc,0x43c4b0);
  pPVar4 = oldTypeHandler;
  iVar10 = DynamicTypeHandler::GetSlotCapacity((DynamicTypeHandler *)newTypeHandler);
  uVar8 = DynamicTypeHandler::GetInlineSlotCapacity((DynamicTypeHandler *)newTypeHandler);
  offsetOfInlineSlots =
       DynamicTypeHandler::GetOffsetOfInlineSlots((DynamicTypeHandler *)newTypeHandler);
  ES5ArrayTypeHandlerBase<unsigned_short>::ES5ArrayTypeHandlerBase
            (pEVar13,(Recycler *)pPVar4,iVar10,uVar8,offsetOfInlineSlots);
  local_38 = pEVar13;
  bVar5 = DynamicTypeHandler::GetHasOnlyWritableDataProperties((DynamicTypeHandler *)pEVar13);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5b2,"(newTypeHandler->GetHasOnlyWritableDataProperties())",
                                "newTypeHandler->GetHasOnlyWritableDataProperties()");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  oldSingletonInstance =
       (RecyclerWeakReference<Js::DynamicObject> *)
       DynamicObject::GetDynamicType((DynamicObject *)scriptContext);
  pRStack_80 = GetSingletonInstance((PathTypeHandlerBase *)newTypeHandler);
  TraceFixedFieldsBeforeTypeHandlerChange
            (L"converting",L"PathTypeHandler",L"DictionaryTypeHandler",
             (DynamicObject *)scriptContext,(DynamicTypeHandler *)newTypeHandler,
             (DynamicType *)oldSingletonInstance,pRStack_80);
  curSingletonInstance._7_1_ =
       DynamicTypeHandler::CanBeSingletonInstance((DynamicObject *)scriptContext);
  if ((!(bool)curSingletonInstance._7_1_) &&
     (bVar5 = HasSingletonInstance((PathTypeHandlerBase *)newTypeHandler), bVar5)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5bd,
                                "(canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance())"
                                ,"canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance()"
                               );
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  bVar5 = HasSingletonInstanceOnlyIfNeeded((PathTypeHandlerBase *)newTypeHandler);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5c9,"(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  if (((curSingletonInstance._7_1_ & 1) != 0) &&
     (bVar5 = DynamicTypeHandler::AreSingletonInstancesNeeded(), bVar5)) {
    pTVar16 = GetTypePath((PathTypeHandlerBase *)newTypeHandler);
    pRStack_90 = TypePath::GetSingletonInstance(pTVar16);
    if ((pRStack_90 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) ||
       (pSVar14 = (ScriptContext *)Memory::RecyclerWeakReference<Js::DynamicObject>::Get(pRStack_90)
       , pSVar14 != scriptContext)) {
      pEVar13 = local_38;
      pRVar15 = DynamicObject::CreateWeakReferenceToSelf((DynamicObject *)scriptContext);
      DynamicTypeHandler::SetSingletonInstance((DynamicTypeHandler *)pEVar13,pRVar15);
    }
    else {
      DynamicTypeHandler::SetSingletonInstance((DynamicTypeHandler *)local_38,pRStack_90);
    }
  }
  attributes._7_1_ = curSingletonInstance._7_1_ & 1;
  bVar5 = DynamicTypeHandler::IsolatePrototypes();
  if ((bVar5) &&
     (bVar6 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)newTypeHandler),
     (bVar6 & 0x20) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5df,
                                "(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0))"
                                ,
                                "!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
                               );
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  bVar6 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)newTypeHandler);
  local_101 = 1;
  if ((bVar6 & 0x20) == 0) {
    bVar5 = DynamicTypeHandler::GetIsOrMayBecomeShared((DynamicTypeHandler *)newTypeHandler);
    local_102 = 0;
    if (bVar5) {
      bVar5 = DynamicTypeHandler::IsolatePrototypes();
      local_102 = bVar5 ^ 0xff;
    }
    local_101 = local_102;
  }
  attributes._6_1_ = local_101 & 1;
  iVar10 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
  typePath = (TypePath *)CONCAT44(extraout_var,iVar10);
  pTStack_a8 = GetTypePath((PathTypeHandlerBase *)newTypeHandler);
  propertyRecord._6_2_ = 0;
  do {
    uVar2 = propertyRecord._6_2_;
    uVar8 = GetPathLength((PathTypeHandlerBase *)newTypeHandler);
    if (uVar8 <= uVar2) {
      bVar5 = FixPropsOnPathTypes();
      if (bVar5) {
        bVar5 = HasSingletonInstanceOnlyIfNeeded((PathTypeHandlerBase *)newTypeHandler);
        if (!bVar5) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0x616,"(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                      "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
          if (!bVar5) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        pTVar16 = GetTypePath((PathTypeHandlerBase *)newTypeHandler);
        TypePath::ClearSingletonInstanceIfSame(pTVar16,(DynamicObject *)scriptContext);
      }
      bVar5 = DynamicTypeHandler::IsolatePrototypes();
      if ((bVar5) &&
         (bVar6 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)newTypeHandler),
         (bVar6 & 0x20) != 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0x61d,
                                    "(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0))"
                                    ,
                                    "!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
                                   );
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      bVar5 = DynamicTypeHandler::GetIsPrototype((DynamicTypeHandler *)local_38);
      if (bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0x61e,"(!newTypeHandler->GetIsPrototype())",
                                    "Why did we create a brand new type handler with a prototype flag set?"
                                   );
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      pEVar13 = local_38;
      values = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)newTypeHandler);
      DynamicTypeHandler::SetFlags((DynamicTypeHandler *)pEVar13,' ',values);
      bVar5 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked((DynamicTypeHandler *)local_38);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0x623,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                    "newTypeHandler->GetIsInlineSlotCapacityLocked()");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      pEVar13 = local_38;
      values_00 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)newTypeHandler);
      DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)pEVar13,0xb0,values_00);
      ES5ArrayTypeHandlerBase<unsigned_short>::SetInstanceTypeHandler
                (local_38,(DynamicObject *)scriptContext,true);
      bVar5 = DictionaryTypeHandlerBase<unsigned_short>::HasSingletonInstance
                        (&local_38->super_DictionaryTypeHandlerBase<unsigned_short>);
      if ((bVar5) && (bVar5 = DynamicObject::HasSharedType((DynamicObject *)scriptContext), bVar5))
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0x628,
                                    "(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType())"
                                    ,
                                    "!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType()"
                                   );
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      pSVar14 = scriptContext;
      oldTypeHandler_00 = newTypeHandler;
      pEVar13 = local_38;
      pRVar15 = oldSingletonInstance;
      newType = DynamicObject::GetDynamicType((DynamicObject *)scriptContext);
      TraceFixedFieldsAfterTypeHandlerChange
                ((DynamicObject *)pSVar14,(DynamicTypeHandler *)oldTypeHandler_00,
                 (DynamicTypeHandler *)pEVar13,(DynamicType *)pRVar15,newType,pRStack_80);
      return local_38;
    }
    if (typePath == (TypePath *)0x0) {
      local_109 = ObjectSlotAttr_Default;
    }
    else {
      local_109 = *(ObjectSlotAttributes *)
                   ((long)&(typePath->data).ptr + (ulong)propertyRecord._6_2_);
    }
    propertyRecord._5_1_ = local_109;
    descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)
                 TypePath::GetPropertyId(pTStack_a8,(uint)propertyRecord._6_2_);
    if (propertyRecord._5_1_ == ObjectSlotAttr_Setter) {
      this_00 = Memory::
                WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                ::operator->(&(local_38->super_DictionaryTypeHandlerBase<unsigned_short>).
                              propertyMap);
      bVar5 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetReference<Js::PropertyRecord_const*>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)this_00,(PropertyRecord **)&descriptor,&stack0xffffffffffffff40);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0x5ef,"(result)","result");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      pTVar16 = typePath;
      uVar9 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDStack_c0);
      pEVar13 = newTypeHandler;
      if ((*(byte *)((long)&(pTVar16->data).ptr + (ulong)uVar9) & 0x10) == 0) {
        if (propertyRecord._6_2_ !=
            (local_38->super_DictionaryTypeHandlerBase<unsigned_short>).nextPropertyIndex) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0x5f4,"(i == newTypeHandler->nextPropertyIndex)",
                                      "i == newTypeHandler->nextPropertyIndex");
          if (!bVar5) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        ::Math::PostInc<unsigned_short>
                  (&(local_38->super_DictionaryTypeHandlerBase<unsigned_short>).nextPropertyIndex);
      }
      else {
        uVar9 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>
                          (pDStack_c0);
        uVar11 = (*(pEVar13->super_DictionaryTypeHandlerBase<unsigned_short>).
                   super_DynamicTypeHandler._vptr_DynamicTypeHandler[0x70])(pEVar13,(ulong)uVar9);
        if ((uVar11 & 0xff) !=
            (uint)(local_38->super_DictionaryTypeHandlerBase<unsigned_short>).nextPropertyIndex) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0x5f8,
                                      "(oldTypeHandler->GetSetterSlotIndex(descriptor->GetDataPropertyIndex<false>()) == newTypeHandler->nextPropertyIndex)"
                                      ,
                                      "oldTypeHandler->GetSetterSlotIndex(descriptor->GetDataPropertyIndex<false>()) == newTypeHandler->nextPropertyIndex"
                                     );
          if (!bVar5) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        DictionaryPropertyDescriptor<unsigned_short>::ConvertToGetterSetter
                  (pDStack_c0,
                   &(local_38->super_DictionaryTypeHandlerBase<unsigned_short>).nextPropertyIndex);
        DynamicTypeHandler::ClearHasOnlyWritableDataProperties((DynamicTypeHandler *)local_38);
      }
    }
    else {
      bVar5 = FixPropsOnPathTypes();
      pEVar13 = local_38;
      propertyRecord_00 = descriptor;
      if (bVar5) {
        PVar7 = ObjectSlotAttributesToPropertyAttributes(propertyRecord._5_1_);
        uVar2 = propertyRecord._6_2_;
        bVar6 = TypePath::GetMaxInitializedLength(pTStack_a8);
        pTVar16 = pTStack_a8;
        PVar3 = propertyRecord._6_2_;
        local_121 = false;
        if ((attributes._7_1_ & 1) != 0) {
          uVar8 = GetPathLength((PathTypeHandlerBase *)newTypeHandler);
          local_121 = TypePath::GetIsFixedFieldAt(pTVar16,PVar3,(uint)uVar8);
        }
        pTVar16 = pTStack_a8;
        PVar3 = propertyRecord._6_2_;
        local_151 = false;
        if ((attributes._6_1_ & 1) != 0) {
          uVar8 = GetPathLength((PathTypeHandlerBase *)newTypeHandler);
          local_151 = TypePath::GetIsUsedFixedFieldAt(pTVar16,PVar3,(uint)uVar8);
        }
        DictionaryTypeHandlerBase<unsigned_short>::Add
                  (&pEVar13->super_DictionaryTypeHandlerBase<unsigned_short>,
                   (PropertyRecord *)propertyRecord_00,PVar7,uVar2 < bVar6,local_121,local_151,
                   (ScriptContext *)recycler);
      }
      else {
        PVar7 = ObjectSlotAttributesToPropertyAttributes(propertyRecord._5_1_);
        DictionaryTypeHandlerBase<unsigned_short>::Add
                  (&pEVar13->super_DictionaryTypeHandlerBase<unsigned_short>,
                   (PropertyRecord *)propertyRecord_00,PVar7,true,false,false,
                   (ScriptContext *)recycler);
      }
    }
    propertyRecord._6_2_ = propertyRecord._6_2_ + 1;
  } while( true );
}

Assistant:

T* PathTypeHandlerBase::ConvertToTypeHandler(DynamicObject* instance)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        instance->PrepareForConversionToNonPathType();

        PathTypeHandlerBase * oldTypeHandler;

        // Ideally 'this' and oldTypeHandler->GetTypeHandler() should be same
        // But we can have calls from external DOM objects, which requests us to replace the type of the
        // object with a new type. And in such cases, this API gets called with oldTypeHandler and the
        // new type (obtained from the External DOM object)
        // We use the duplicated typeHandler, if we deOptimized the object successfully, else we retain the earlier
        // behavior of using 'this' pointer.

        if (instance->DeoptimizeObjectHeaderInlining())
        {
            oldTypeHandler = reinterpret_cast<PathTypeHandlerBase *>(instance->GetTypeHandler());
        }
        else
        {
            oldTypeHandler = this;
        }

        Assert(oldTypeHandler);

        T* newTypeHandler = RecyclerNew(recycler, T, recycler, oldTypeHandler->GetSlotCapacity(), oldTypeHandler->GetInlineSlotCapacity(), oldTypeHandler->GetOffsetOfInlineSlots());
        // We expect the new type handler to start off marked as having only writable data properties.
        Assert(newTypeHandler->GetHasOnlyWritableDataProperties());

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        DynamicType* oldType = instance->GetDynamicType();
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = oldTypeHandler->GetSingletonInstance();
        oldTypeHandler->TraceFixedFieldsBeforeTypeHandlerChange(_u("converting"), _u("PathTypeHandler"), _u("DictionaryTypeHandler"), instance, oldTypeHandler, oldType, oldSingletonInstance);
#endif

        bool const canBeSingletonInstance = DynamicTypeHandler::CanBeSingletonInstance(instance);
        // If this type had been installed on a stack instance it shouldn't have a singleton Instance
        Assert(canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance());

        // This instance may not be the singleton instance for this handler. There may be a singleton at the tip
        // and this instance may be getting initialized via an object literal and one of the properties may
        // be an accessor.  In this case we will convert to a DictionaryTypeHandler and it's correct to
        // transfer this instance, even tough different from the singleton. Ironically, this instance
        // may even appear to be at the tip along with the other singleton, because the set of properties (by
        // name, not value) may be identical.
        // Consider: Consider threading PropertyOperation_Init through InitProperty and SetAccessors,
        // to be sure that we don't assert only in this narrow case.
        // Assert(this->typePath->GetSingletonInstance() == instance);

        Assert(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded());

        // Don't install stack instance as singleton instance
        if (canBeSingletonInstance)
        {
            if (DynamicTypeHandler::AreSingletonInstancesNeeded())
            {
                RecyclerWeakReference<DynamicObject>* curSingletonInstance = oldTypeHandler->GetTypePath()->GetSingletonInstance();
                if (curSingletonInstance != nullptr && curSingletonInstance->Get() == instance)
                {
                    newTypeHandler->SetSingletonInstance(curSingletonInstance);
                }
                else
                {
                    newTypeHandler->SetSingletonInstance(instance->CreateWeakReferenceToSelf());
                }
            }
        }

        bool transferFixed = canBeSingletonInstance;

        // If we are a prototype or may become a prototype we must transfer used as fixed bits.  See point 4 in ConvertToSimpleDictionaryType.
        Assert(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0));
        bool transferUsedAsFixed = ((oldTypeHandler->GetFlags() & IsPrototypeFlag) != 0 || (oldTypeHandler->GetIsOrMayBecomeShared() && !DynamicTypeHandler::IsolatePrototypes()));
#endif

        ObjectSlotAttributes * attributes = this->GetAttributeArray();
        TypePath * typePath = oldTypeHandler->GetTypePath();
        for (PropertyIndex i = 0; i < oldTypeHandler->GetPathLength(); i++)
        {
            ObjectSlotAttributes attr = attributes ? attributes[i] : ObjectSlotAttr_Default;
            const PropertyRecord * propertyRecord = typePath->GetPropertyId(i);
            if (attr == ObjectSlotAttr_Setter)
            {
                // Adding a setter. Don't add another descriptor. Find the getter and convert its descriptor, which will cause
                // the setter to get the next free slot.
                DictionaryPropertyDescriptor<PropertyIndex> *descriptor;
                bool result = newTypeHandler->propertyMap->TryGetReference(propertyRecord, &descriptor);
                Assert(result);
                if (!(attributes[descriptor->GetDataPropertyIndex<false>()] & ObjectSlotAttr_Accessor))
                {
                    // Setter without a getter; this is a stale entry, so ignore it
                    // Just consume the slot so no descriptor refers to it.
                    Assert(i == newTypeHandler->nextPropertyIndex);
                    ::Math::PostInc(newTypeHandler->nextPropertyIndex);
                    continue;
                }
                Assert(oldTypeHandler->GetSetterSlotIndex(descriptor->GetDataPropertyIndex<false>()) == newTypeHandler->nextPropertyIndex);
                descriptor->ConvertToGetterSetter(newTypeHandler->nextPropertyIndex);
                newTypeHandler->ClearHasOnlyWritableDataProperties();
            }
            else
            {
#if ENABLE_FIXED_FIELDS
                // Consider: As noted in point 2 in ConvertToSimpleDictionaryType, when converting to non-shared handler we could be more
                // aggressive and mark every field as fixed, because we will always take a type transition. We have to remember to respect
                // the switches as to which kinds of properties we should fix, and for that we need the values from the instance. Even if
                // the type handler says the property is initialized, the current instance may not have a value for it. Check for value != null.
                if (PathTypeHandlerBase::FixPropsOnPathTypes())
                {
                    newTypeHandler->Add(propertyRecord, ObjectSlotAttributesToPropertyAttributes(attr),
                        i < typePath->GetMaxInitializedLength(),
                        transferFixed && typePath->GetIsFixedFieldAt(i, oldTypeHandler->GetPathLength()),
                        transferUsedAsFixed && typePath->GetIsUsedFixedFieldAt(i, oldTypeHandler->GetPathLength()),
                        scriptContext);
                }
                else
#endif
                {
                    newTypeHandler->Add(propertyRecord, ObjectSlotAttributesToPropertyAttributes(attr), true, false, false, scriptContext);
                }
            }
        }

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        if (PathTypeHandlerBase::FixPropsOnPathTypes())
        {
            Assert(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded());
            oldTypeHandler->GetTypePath()->ClearSingletonInstanceIfSame(instance);
        }
#endif

        // PathTypeHandlers are always shared, so if we're isolating prototypes, a PathTypeHandler should
        // never have the prototype flag set.
        Assert(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0));
        AssertMsg(!newTypeHandler->GetIsPrototype(), "Why did we create a brand new type handler with a prototype flag set?");
        newTypeHandler->SetFlags(IsPrototypeFlag, oldTypeHandler->GetFlags());

        // Any new type handler we expect to see here should have inline slot capacity locked.  If this were to change, we would need
        // to update our shrinking logic (see ShrinkSlotAndInlineSlotCapacity).
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, oldTypeHandler->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);

#if ENABLE_FIXED_FIELDS
        Assert(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType());

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        PathTypeHandlerBase::TraceFixedFieldsAfterTypeHandlerChange(instance, oldTypeHandler, newTypeHandler, oldType, instance->GetDynamicType(), oldSingletonInstance);
#endif
#endif

        return newTypeHandler;
    }